

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_srar_b_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  byte bVar1;
  uint uVar2;
  char cVar3;
  
  cVar3 = *(char *)((env->active_fpu).fpr + ws);
  bVar1 = *(byte *)((env->active_fpu).fpr + wt);
  uVar2 = bVar1 & 7;
  if ((bVar1 & 7) != 0) {
    cVar3 = (char)((long)cVar3 >> (sbyte)uVar2) +
            (((ulong)(long)cVar3 >> ((ulong)(uVar2 - 1) & 0x3f) & 1) != 0);
  }
  *(char *)((env->active_fpu).fpr + wd) = cVar3;
  cVar3 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 1);
  uVar2 = bVar1 & 7;
  if ((bVar1 & 7) != 0) {
    cVar3 = (char)((long)cVar3 >> (sbyte)uVar2) +
            (((ulong)(long)cVar3 >> ((ulong)(uVar2 - 1) & 0x3f) & 1) != 0);
  }
  *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 1) = cVar3;
  cVar3 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2);
  uVar2 = bVar1 & 7;
  if ((bVar1 & 7) != 0) {
    cVar3 = (char)((long)cVar3 >> (sbyte)uVar2) +
            (((ulong)(long)cVar3 >> ((ulong)(uVar2 - 1) & 0x3f) & 1) != 0);
  }
  *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2) = cVar3;
  cVar3 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 3);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 3);
  uVar2 = bVar1 & 7;
  if ((bVar1 & 7) != 0) {
    cVar3 = (char)((long)cVar3 >> (sbyte)uVar2) +
            (((ulong)(long)cVar3 >> ((ulong)(uVar2 - 1) & 0x3f) & 1) != 0);
  }
  *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 3) = cVar3;
  cVar3 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
  uVar2 = bVar1 & 7;
  if ((bVar1 & 7) != 0) {
    cVar3 = (char)((long)cVar3 >> (sbyte)uVar2) +
            (((ulong)(long)cVar3 >> ((ulong)(uVar2 - 1) & 0x3f) & 1) != 0);
  }
  *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = cVar3;
  cVar3 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 5);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 5);
  uVar2 = bVar1 & 7;
  if ((bVar1 & 7) != 0) {
    cVar3 = (char)((long)cVar3 >> (sbyte)uVar2) +
            (((ulong)(long)cVar3 >> ((ulong)(uVar2 - 1) & 0x3f) & 1) != 0);
  }
  *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 5) = cVar3;
  cVar3 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6);
  uVar2 = bVar1 & 7;
  if ((bVar1 & 7) != 0) {
    cVar3 = (char)((long)cVar3 >> (sbyte)uVar2) +
            (((ulong)(long)cVar3 >> ((ulong)(uVar2 - 1) & 0x3f) & 1) != 0);
  }
  *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6) = cVar3;
  cVar3 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 7);
  uVar2 = bVar1 & 7;
  if ((bVar1 & 7) != 0) {
    cVar3 = (char)((long)cVar3 >> (sbyte)uVar2) +
            (((ulong)(long)cVar3 >> ((ulong)(uVar2 - 1) & 0x3f) & 1) != 0);
  }
  *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 7) = cVar3;
  cVar3 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
  uVar2 = bVar1 & 7;
  if ((bVar1 & 7) != 0) {
    cVar3 = (char)((long)cVar3 >> (sbyte)uVar2) +
            (((ulong)(long)cVar3 >> ((ulong)(uVar2 - 1) & 0x3f) & 1) != 0);
  }
  *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = cVar3;
  cVar3 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 9);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 9);
  uVar2 = bVar1 & 7;
  if ((bVar1 & 7) != 0) {
    cVar3 = (char)((long)cVar3 >> (sbyte)uVar2) +
            (((ulong)(long)cVar3 >> ((ulong)(uVar2 - 1) & 0x3f) & 1) != 0);
  }
  *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 9) = cVar3;
  cVar3 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10);
  uVar2 = bVar1 & 7;
  if ((bVar1 & 7) != 0) {
    cVar3 = (char)((long)cVar3 >> (sbyte)uVar2) +
            (((ulong)(long)cVar3 >> ((ulong)(uVar2 - 1) & 0x3f) & 1) != 0);
  }
  *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10) = cVar3;
  cVar3 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xb);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xb);
  uVar2 = bVar1 & 7;
  if ((bVar1 & 7) != 0) {
    cVar3 = (char)((long)cVar3 >> (sbyte)uVar2) +
            (((ulong)(long)cVar3 >> ((ulong)(uVar2 - 1) & 0x3f) & 1) != 0);
  }
  *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xb) = cVar3;
  cVar3 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
  uVar2 = bVar1 & 7;
  if ((bVar1 & 7) != 0) {
    cVar3 = (char)((long)cVar3 >> (sbyte)uVar2) +
            (((ulong)(long)cVar3 >> ((ulong)(uVar2 - 1) & 0x3f) & 1) != 0);
  }
  *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = cVar3;
  cVar3 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xd);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xd);
  uVar2 = bVar1 & 7;
  if ((bVar1 & 7) != 0) {
    cVar3 = (char)((long)cVar3 >> (sbyte)uVar2) +
            (((ulong)(long)cVar3 >> ((ulong)(uVar2 - 1) & 0x3f) & 1) != 0);
  }
  *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xd) = cVar3;
  cVar3 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe);
  uVar2 = bVar1 & 7;
  if ((bVar1 & 7) != 0) {
    cVar3 = (char)((long)cVar3 >> (sbyte)uVar2) +
            (((ulong)(long)cVar3 >> ((ulong)(uVar2 - 1) & 0x3f) & 1) != 0);
  }
  *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe) = cVar3;
  cVar3 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xf);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xf);
  uVar2 = bVar1 & 7;
  if ((bVar1 & 7) != 0) {
    cVar3 = (char)((long)cVar3 >> (sbyte)uVar2) +
            (((ulong)(long)cVar3 >> ((ulong)(uVar2 - 1) & 0x3f) & 1) != 0);
  }
  *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xf) = cVar3;
  return;
}

Assistant:

void helper_msa_srar_b(CPUMIPSState *env,
                       uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_srar_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_srar_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_srar_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_srar_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_srar_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_srar_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_srar_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_srar_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_srar_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_srar_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_srar_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_srar_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_srar_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_srar_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_srar_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_srar_df(DF_BYTE, pws->b[15], pwt->b[15]);
}